

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O2

void __thiscall toml::detail::syntax::non_ascii::non_ascii(non_ascii *this,spec *s)

{
  sequence local_70;
  sequence local_50;
  sequence local_30;
  
  (this->super_scanner_base)._vptr_scanner_base = (_func_int **)&PTR__non_ascii_004cd6a0;
  utf8_2bytes(&local_30,s);
  utf8_3bytes(&local_50,s);
  utf8_4bytes(&local_70,s);
  either::either<toml::detail::sequence,toml::detail::sequence,toml::detail::sequence>
            (&this->scanner_,&local_30,&local_50,&local_70);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_70.others_);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_50.others_);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_30.others_);
  return;
}

Assistant:

TOML11_INLINE non_ascii::non_ascii(const spec& s) noexcept
    : scanner_(utf8_2bytes(s), utf8_3bytes(s), utf8_4bytes(s))
{}